

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backtrace.cpp
# Opt level: O2

string * sh(string *__return_storage_ptr__,string *cmd)

{
  int iVar1;
  FILE *__p;
  char *pcVar2;
  runtime_error *this;
  shared_ptr<_IO_FILE> pipe;
  array<char,_128UL> buffer;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __p = popen((cmd->_M_dataplus)._M_p,"r");
  std::__shared_ptr<_IO_FILE,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<_IO_FILE,int(*)(_IO_FILE*),void>
            ((__shared_ptr<_IO_FILE,(__gnu_cxx::_Lock_policy)2> *)&pipe,(_IO_FILE *)__p,pclose);
  if (pipe.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"popen() failed!");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  while (iVar1 = feof((FILE *)pipe.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
        iVar1 == 0) {
    pcVar2 = fgets(buffer._M_elems,0x80,
                   (FILE *)pipe.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pipe.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

string sh(string cmd) {
    array<char, 128> buffer;
    string result;
    shared_ptr<FILE> pipe(popen(cmd.c_str(), "r"), pclose);
    if (!pipe) throw runtime_error("popen() failed!");
    while (!feof(pipe.get())) {
        if (fgets(buffer.data(), 128, pipe.get()) != nullptr) {
            result += buffer.data();
        }
    }
    return result;
}